

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O2

int * __thiscall
cornerstone::async_result<int,_std::shared_ptr<std::exception>_>::get
          (async_result<int,_std::shared_ptr<std::exception>_> *this)

{
  __shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2> *this_00;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->lock_);
  if (this->has_result_ != true) {
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  if ((this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return &this->result_;
  }
  this_00 = (__shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2> *)
            __cxa_allocate_exception(0x10);
  std::__shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (this_00,&(this->err_).super___shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>);
  __cxa_throw(this_00,&std::shared_ptr<std::exception>::typeinfo,
              std::__shared_ptr<std::exception,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr);
}

Assistant:

T& get()
    {
        std::unique_lock<std::mutex> lock(lock_);
        if (has_result_)
        {
            if (err_ == nullptr)
            {
                return result_;
            }

            throw err_;
        }

        cv_.wait(lock);
        if (err_ == nullptr)
        {
            return result_;
        }

        throw err_;
    }